

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celtexture.cpp
# Opt level: O2

bool anon_unknown.dwarf_842773::LoadCELLump(int lumpnum,CELPalette *palette,BYTE **pixels)

{
  bool bVar1;
  undefined1 extraout_AL;
  long lVar2;
  BYTE *buffer;
  ulong uVar3;
  ulong len;
  FWadLump lump;
  CELHeader header;
  
  FWadCollection::OpenLumpNum(&lump,&Wads,lumpnum);
  bVar1 = LoadCELHeader(&lump.super_FileReader,&header);
  if (bVar1) {
    lVar2 = FWadLump::Read(&lump,palette,0x300);
    if (lVar2 == 0x300) {
      for (lVar2 = 2; lVar2 != 0x302; lVar2 = lVar2 + 3) {
        palette[-1][lVar2 + 0x2fe] = palette[-1][lVar2 + 0x2fe] << 2;
        palette[-1][lVar2 + 0x2ff] = palette[-1][lVar2 + 0x2ff] << 2;
        (*palette)[lVar2] = (*palette)[lVar2] << 2;
      }
      len = (ulong)header.size;
      buffer = (BYTE *)operator_new__(len);
      *pixels = buffer;
      uVar3 = FWadLump::Read(&lump,buffer,len);
      if ((uVar3 != len) && (*pixels != (BYTE *)0x0)) {
        operator_delete__(*pixels);
      }
    }
  }
  FWadLump::~FWadLump(&lump);
  return (bool)extraout_AL;
}

Assistant:

bool LoadCELLump(const int lumpnum, CELPalette& palette, BYTE*& pixels)
	{
		FWadLump lump = Wads.OpenLumpNum(lumpnum);

		// Read header

		CELHeader header;

		if (!LoadCELHeader(lump, header))
		{
			return false;
		}

		// Read palette
		// and convert from its resolution from 0..63 to 0..255

		if (sizeof palette != lump.Read(&palette, sizeof palette))
		{
			return false;
		}

		for (size_t i = 0; i < 256; ++i)
		{
			BYTE* color = &palette[3 * i];
			color[0] *= 4;
			color[1] *= 4;
			color[2] *= 4;
		}

		// Read pixels

		pixels = new BYTE[header.size];

		if (header.size != lump.Read(pixels, header.size))
		{
			delete[] pixels;
			return false;
		}

		return true;
	}